

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeIterator.hpp
# Opt level: O2

treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> * __thiscall
ft::treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
          (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *this)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  bool bVar3;
  
  ptVar1 = this->m_node->right;
  ptVar2 = this->m_node;
  if (ptVar1 == this->m_tree->NIL) {
    do {
      ptVar1 = ptVar2->parent;
      bVar3 = ptVar1->right == ptVar2;
      ptVar2 = ptVar1;
    } while (bVar3);
  }
  else {
    this->m_node = ptVar1;
    ptVar1 = leftEnd(this,ptVar1);
  }
  this->m_node = ptVar1;
  return this;
}

Assistant:

treeIterator&	operator++()
	{
		if (this->node()->right != this->m_tree->NIL) {
			this->m_node = this->node()->right;
			this->m_node = this->leftEnd(this->node());
		} else {
			treeNode<value_type>*	prev = this->node();
			this->m_node = this->node()->parent;
			while (this->node()->right == prev)
			{
				prev = this->node();
				this->m_node = this->node()->parent;
			}
		}
		return *this;
	}